

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

Gia_Man_t * Nf_ManDeriveMapping(Nf_Man_t *p)

{
  long lVar1;
  uint *puVar2;
  Nf_Cfg_t NVar3;
  Vec_Int_t *pVVar4;
  Nf_Obj_t *pNVar5;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  ulong uVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  size_t __size;
  Nf_Mat_t *pNVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  
  pGVar10 = p->pGia;
  if (pGVar10->vCellMapping != (Vec_Int_t *)0x0) {
    __assert_fail("p->pGia->vCellMapping == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                  ,0x811,"Gia_Man_t *Nf_ManDeriveMapping(Nf_Man_t *)");
  }
  iVar7 = pGVar10->nObjs;
  iVar18 = (int)p->pPars->Edge;
  iVar20 = (int)p->pPars->Area + iVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < (iVar18 + iVar20 * 2) - 1U) {
    iVar13 = iVar18 + iVar20 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar8;
  uVar6 = (long)iVar7 * 2;
  iVar18 = (int)uVar6;
  if (iVar13 < iVar18) {
    __size = (long)iVar7 << 3;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(__size);
    }
    else {
      piVar8 = (int *)realloc(piVar8,__size);
    }
    p_00->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = iVar18;
  }
  if (0 < iVar7) {
    memset(p_00->pArray,0,(uVar6 & 0xffffffff) << 2);
  }
  p_00->nSize = iVar18;
  pVVar4 = pGVar10->vCis;
  if (0 < pVVar4->nSize) {
    piVar8 = pVVar4->pArray;
    lVar12 = 0;
    do {
      uVar14 = piVar8[lVar12];
      if (((int)uVar14 < 0) || (pGVar10->nObjs <= (int)uVar14)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((ulong)uVar14 == 0) break;
      lVar19 = (ulong)uVar14 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar19) goto LAB_00733535;
      if ((p->vMapRefs).pArray[lVar19] != 0) {
        if (p_00->nSize <= (int)lVar19) goto LAB_00733554;
        p_00->pArray[lVar19] = -1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar4->nSize);
  }
  pGVar10 = p->pGia;
  if (0 < pGVar10->nObjs) {
    lVar12 = 0;
    do {
      uVar14 = (uint)*(undefined8 *)(pGVar10->pObjs + lVar12);
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        uVar6 = lVar12 * 2;
        if ((((int)uVar14 < 0) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar14 & 0x1fffffff) !=
            ((uint)((ulong)*(undefined8 *)(pGVar10->pObjs + lVar12) >> 0x20) & 0x1fffffff))) {
          lVar19 = 0;
          do {
            lVar1 = uVar6 + lVar19;
            iVar7 = (int)lVar1;
            if ((p->vMapRefs).nSize <= iVar7) goto LAB_00733535;
            if ((p->vMapRefs).pArray[lVar1] != 0) {
              pNVar5 = p->pNfObjs;
              uVar14 = *(uint *)pNVar5[lVar12].M[lVar19];
              uVar16 = *(uint *)(pNVar5[lVar12].M[lVar19] + 1);
              if (-1 < (int)(uVar16 ^ uVar14)) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x57b,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar17 = (Nf_Mat_t *)0x0;
              if ((int)uVar14 < 0) {
                pNVar17 = pNVar5[lVar12].M[lVar19];
              }
              if ((int)uVar16 < 0) {
                pNVar17 = pNVar5[lVar12].M[lVar19] + 1;
              }
              if ((*(uint *)&pNVar17->field_0x0 >> 0x1e & 1) == 0) {
                if ((p->vCutSets).nSize <= lVar12) goto LAB_00733535;
                uVar14 = (p->vCutSets).pArray[lVar12];
                uVar16 = (int)uVar14 >> 0x10;
                if (((int)uVar16 < 0) || ((p->vPages).nSize <= (int)uVar16)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar11 = *(uint *)&pNVar17->field_0x0 >> 0x14 & 0x3ff;
                if (uVar11 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x93,"int *Nf_CutFromHandle(int *, int)");
                }
                if (p_00->nSize <= iVar7) goto LAB_00733554;
                puVar2 = (uint *)((long)(p->vPages).pArray[uVar16] +
                                 (ulong)uVar11 * 4 + (ulong)(uVar14 & 0xffff) * 4);
                p_00->pArray[lVar1] = p_00->nSize;
                Vec_IntPush(p_00,*puVar2 & 0x1f);
                if ((*puVar2 & 0x1f) != 0) {
                  bVar15 = 0;
                  uVar14 = 0;
                  do {
                    NVar3 = ((Nf_Mat_t *)&pNVar17->field_0x0)->Cfg;
                    uVar16 = puVar2[(ulong)(((uint)NVar3 >> 8) >> (bVar15 & 0x1f) & 0xf) + 1];
                    if (uVar16 == 0) break;
                    if ((int)uVar16 < 0) {
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                    ,0xf1,"int Abc_Var2Lit(int, int)");
                    }
                    Vec_IntPush(p_00,(uint)((((uint)NVar3 >> 1 & 0x7f) >> (uVar14 & 0x1f) & 1) != 0)
                                     + uVar16 * 2);
                    uVar14 = uVar14 + 1;
                    bVar15 = bVar15 + 4;
                  } while (uVar14 < (*puVar2 & 0x1f));
                }
                Vec_IntPush(p_00,*(uint *)&pNVar17->field_0x0 & 0xfffff);
              }
              else {
                if (p_00->nSize <= iVar7) goto LAB_00733554;
                p_00->pArray[lVar1] = -1;
              }
            }
            bVar21 = lVar19 == 0;
            lVar19 = lVar19 + 1;
          } while (bVar21);
        }
        else {
          uVar9 = uVar6 | 1;
          if ((p->vMapRefs).nSize <= (int)uVar9) {
LAB_00733535:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((p->vMapRefs).pArray[uVar9] != 0) {
            if (p_00->nSize <= (int)uVar9) {
LAB_00733554:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p_00->pArray[uVar9] = -1;
          }
          if (p_00->nSize <= (int)uVar6) goto LAB_00733554;
          p_00->pArray[lVar12 * 2] = -2;
        }
      }
      lVar12 = lVar12 + 1;
      pGVar10 = p->pGia;
    } while (lVar12 < pGVar10->nObjs);
  }
  pGVar10->vCellMapping = p_00;
  return pGVar10;
}

Assistant:

Gia_Man_t * Nf_ManDeriveMapping( Nf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Nf_Mat_t * pM;
    int i, k, c, Id, iVar, fCompl, * pCut;
    assert( p->pGia->vCellMapping == NULL );
    vMapping = Vec_IntAlloc( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, 2*Gia_ManObjNum(p->pGia), 0 );
    // create CI inverters
    Gia_ManForEachCiId( p->pGia, Id, i )
    if ( Nf_ObjMapRefNum(p, Id, 1) )
        Vec_IntWriteEntry( vMapping, Abc_Var2Lit(Id, 1), -1 );
    // create internal nodes
    Gia_ManForEachAndId( p->pGia, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj(p->pGia, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 1), -1 );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, 0), -2 );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            // remember inverter
            if ( pM->fCompl )
            {
                Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), -1 );
                continue;
            }
    //        Nf_ManCutMatchPrint( p, i, c, pM );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            Vec_IntWriteEntry( vMapping, Abc_Var2Lit(i, c), Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Nf_CutSize(pCut) );
            Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
                Vec_IntPush( vMapping, Abc_Var2Lit(iVar, fCompl) );
            Vec_IntPush( vMapping, pM->Gate );
        }
    }
//    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vCellMapping = vMapping;
    return p->pGia;
}